

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O2

int mem_has_null(void *block,uint size)

{
  char *pcVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    if (size == uVar2) {
      return 0;
    }
    pcVar1 = (char *)((long)block + uVar2);
    uVar2 = uVar2 + 1;
  } while (*pcVar1 != '\0');
  return 1;
}

Assistant:

int mem_has_null(const void *block, unsigned size)
{
	const unsigned char *bytes = block;
	unsigned i;        
	for(i = 0; i < size; i++)
	{
		if(bytes[i] == 0)
		{
			return 1;
		}
	}
	return 0;
}